

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.h
# Opt level: O1

void __thiscall
oout::ContainTest::ContainTest<std::shared_ptr<oout::ContainMatch>>
          (ContainTest *this,shared_ptr<const_oout::Text> *text,string *sub,
          shared_ptr<oout::ContainMatch> *subs)

{
  undefined1 local_41;
  ContainMatch *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  shared_ptr<const_oout::Match> local_30;
  shared_ptr<const_oout::Match> local_20;
  
  local_30.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((subs->super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_Match;
  local_30.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (subs->super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_30.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_30.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_30.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_40 = (ContainMatch *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,std::__cxx11::string_const&>
            (&_Stack_38,&local_40,(allocator<oout::ContainMatch> *)&local_41,sub);
  local_20.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_40->super_Match;
  local_20.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_38._M_pi;
  local_40 = (ContainMatch *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ContainTest<>(this,text,&local_30,&local_20);
  if (local_20.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
  }
  if (local_30.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

ContainTest(
		const std::shared_ptr<const Text> &text,
		const std::string &sub,
		S ... subs
	) : ContainTest(text, subs..., std::make_shared<ContainMatch>(sub))
	{
	}